

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_color_argb(int count,QT_FT_Span *spans,void *userData)

{
  quint32 *pqVar1;
  byte bVar2;
  char cVar3;
  QRgb x;
  uint uVar4;
  uint uVar5;
  QThreadPool *pQVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int i;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QSemaphore semaphore;
  Operator op;
  anon_class_32_4_8e14794e local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,(QT_FT_Span *)0x0,0);
  x = QColor::rgba((QColor *)((long)userData + 0x98));
  if (op.mode == CompositionMode_Source) {
    while (bVar13 = count != 0, count = count + -1, bVar13) {
      pqVar1 = (quint32 *)
               ((long)spans->y * *(long *)(*userData + 0x28) + *(long *)(*userData + 0x38) +
               (long)spans->x * 4);
      bVar2 = spans->coverage;
      iVar10 = spans->len;
      if (bVar2 == 0xff) {
        (*qt_memfill32)(pqVar1,x,(long)iVar10);
      }
      else if (iVar10 < 0x11) {
        uVar4 = BYTE_MUL(x,(uint)bVar2);
        for (lVar9 = 0; lVar9 < iVar10; lVar9 = lVar9 + 1) {
          uVar5 = BYTE_MUL(pqVar1[lVar9],(uint)(byte)~bVar2);
          pqVar1[lVar9] = uVar5 + uVar4;
          iVar10 = spans->len;
        }
      }
      else {
        (*op.funcSolid)(pqVar1,iVar10,x,(uint)bVar2);
      }
      spans = spans + 1;
    }
  }
  else {
    local_58.funcSolid = op.funcSolid;
    local_58._28_4_ = 0xaaaaaaaa;
    local_58.color = x;
    uVar12 = (long)(count + 0x20) / 0x40 & 0xffffffff;
    local_58.data = (QSpanData *)userData;
    local_58.spans = spans;
    pQVar6 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((0x5f < count) && (pQVar6 != (QThreadPool *)0x0)) &&
       (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
      QThread::currentThread();
      cVar3 = QThreadPool::contains((QThread *)pQVar6);
      if (cVar3 == '\0') {
        _semaphore = &DAT_aaaaaaaaaaaaaaaa;
        iVar10 = 0;
        QSemaphore::QSemaphore(&semaphore,0);
        while( true ) {
          iVar11 = (int)uVar12;
          uVar12 = (ulong)(iVar11 - 1);
          if (iVar11 == 0) break;
          iVar11 = (count - iVar10) / iVar11;
          puVar7 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar7 + 1) = 1;
          *puVar7 = QFactoryLoader::keyMap;
          puVar8 = (undefined8 *)operator_new(0x20);
          *puVar8 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4058:5)>
                    ::impl;
          *(int *)(puVar8 + 1) = iVar10;
          *(int *)((long)puVar8 + 0xc) = iVar11;
          puVar8[2] = &local_58;
          puVar8[3] = &semaphore;
          puVar7[2] = puVar8;
          QThreadPool::start((QRunnable *)pQVar6,(int)puVar7);
          iVar10 = iVar10 + iVar11;
        }
        QSemaphore::acquire((int)&semaphore);
        QSemaphore::~QSemaphore(&semaphore);
        goto LAB_005a8254;
      }
    }
    blend_color_argb::anon_class_32_4_8e14794e::operator()(&local_58,0,count);
  }
LAB_005a8254:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void blend_color_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, nullptr, 0);
    const uint color = data->solidColor.rgba();

    if (op.mode == QPainter::CompositionMode_Source) {
        // inline for performance
        while (count--) {
            uint *target = ((uint *)data->rasterBuffer->scanLine(spans->y)) + spans->x;
            if (spans->coverage == 255) {
                qt_memfill(target, color, spans->len);
#ifdef __SSE2__
            } else if (spans->len > 16) {
                op.funcSolid(target, spans->len, color, spans->coverage);
#endif
            } else {
                uint c = BYTE_MUL(color, spans->coverage);
                int ialpha = 255 - spans->coverage;
                for (int i = 0; i < spans->len; ++i)
                    target[i] = c + BYTE_MUL(target[i], ialpha);
            }
            ++spans;
        }
        return;
    }
    const auto funcSolid = op.funcSolid;
    auto function = [=] (int cStart, int cEnd) {
        for (int c = cStart; c < cEnd; ++c) {
            uint *target = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + spans[c].x;
            funcSolid(target, spans[c].len, color, spans[c].coverage);
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}